

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O2

void __thiscall
QOpenGLCompositor::changeWindowIndex
          (QOpenGLCompositor *this,QOpenGLCompositorWindow *window,int newIdx)

{
  QList<QOpenGLCompositorWindow_*> *vector;
  int iVar1;
  qsizetype qVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QOpenGLCompositorWindow *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  vector = &this->m_windows;
  local_28 = window;
  qVar2 = QtPrivate::indexOf<QOpenGLCompositorWindow*,QOpenGLCompositorWindow*>(vector,&local_28,0);
  iVar1 = (int)qVar2;
  if (iVar1 != newIdx && iVar1 != -1) {
    QList<QOpenGLCompositorWindow_*>::move(vector,(long)iVar1,(long)newIdx);
    ensureCorrectZOrder(this);
    if (local_28 == (this->m_windows).d.ptr[(this->m_windows).d.size + -1]) {
      iVar3 = QList<QOpenGLCompositorWindow_*>::end(vector);
      topWindowChanged(this,iVar3.i[-1]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositor::changeWindowIndex(QOpenGLCompositorWindow *window, int newIdx)
{
    int idx = m_windows.indexOf(window);
    if (idx != -1 && idx != newIdx) {
        m_windows.move(idx, newIdx);
        ensureCorrectZOrder();
        if (window == m_windows.constLast())
            emit topWindowChanged(m_windows.last());
    }
}